

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

uint32_t trico_get_number_of_attributes(void *a)

{
  if (((*(int *)((long)a + 0x24) - 0xfU < 6) && (*(int *)((long)a + 0x40) == 0)) &&
     ((ulong)((long)*(uint32_t **)((long)a + 0x18) + (4 - *(long *)((long)a + 0x10))) <=
      *(ulong *)((long)a + 0x30))) {
    return **(uint32_t **)((long)a + 0x18);
  }
  return 0;
}

Assistant:

uint32_t trico_get_number_of_attributes(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_attribute_float_stream || arch->next_stream_type == trico_attribute_double_stream ||
    arch->next_stream_type == trico_attribute_uint8_stream || arch->next_stream_type == trico_attribute_uint16_stream ||
    arch->next_stream_type == trico_attribute_uint32_stream || arch->next_stream_type == trico_attribute_uint64_stream)
    {
    uint32_t nr_attribs;
    if (!read_inplace(&nr_attribs, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_attribs;
    }
  return 0;
  }